

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

char * __thiscall
Fossilize::ConcurrentDatabase::get_db_path_for_hash
          (ConcurrentDatabase *this,ResourceTag tag,Hash hash)

{
  DatabaseInterface *pDVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *extra;
  pointer puVar5;
  
  pDVar1 = (this->readonly_interface)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if ((pDVar1 != (DatabaseInterface *)0x0) &&
     (iVar4 = (*pDVar1->_vptr_DatabaseInterface[5])(pDVar1,tag,hash), (char)iVar4 != '\0')) {
    pDVar1 = (this->readonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    iVar4 = (*pDVar1->_vptr_DatabaseInterface[8])(pDVar1,tag,hash);
    return (char *)CONCAT44(extraout_var,iVar4);
  }
  puVar5 = (this->extra_readonly).
           super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->extra_readonly).
           super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar5 == puVar2) {
      return (char *)0x0;
    }
    pDVar1 = (puVar5->_M_t).
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    bVar3 = true;
    if ((pDVar1 != (DatabaseInterface *)0x0) &&
       (iVar4 = (*pDVar1->_vptr_DatabaseInterface[5])(pDVar1,tag,hash), (char)iVar4 != '\0')) {
      pDVar1 = (puVar5->_M_t).
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      iVar4 = (*pDVar1->_vptr_DatabaseInterface[8])(pDVar1,tag,hash);
      this = (ConcurrentDatabase *)CONCAT44(extraout_var_00,iVar4);
      bVar3 = false;
    }
    if (!bVar3) break;
    puVar5 = puVar5 + 1;
  }
  return (char *)this;
}

Assistant:

const char *get_db_path_for_hash(ResourceTag tag, Hash hash) override
	{
		if (readonly_interface && readonly_interface->has_entry(tag, hash))
			return readonly_interface->get_db_path_for_hash(tag, hash);

		for (auto &extra : extra_readonly)
		{
			if (extra && extra->has_entry(tag, hash))
				return extra->get_db_path_for_hash(tag, hash);
		}

		return nullptr;
	}